

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpec::NamePattern::~NamePattern(NamePattern *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__NamePattern_00237bb8;
  WildcardPattern::~WildcardPattern((WildcardPattern *)0x1a0e0a);
  Pattern::~Pattern((Pattern *)0x1a0e14);
  return;
}

Assistant:

TestSpec::NamePattern::~NamePattern() {}